

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiodevice.cpp
# Opt level: O2

QString * __thiscall QIODevice::errorString(QString *__return_storage_ptr__,QIODevice *this)

{
  QObjectData *pQVar1;
  
  pQVar1 = (this->super_QObject).d_ptr.d;
  if (pQVar1[4].metaObject == (QDynamicMetaObjectData *)0x0) {
    tr(__return_storage_ptr__,"Unknown error",(char *)0x0,-1);
  }
  else {
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (&__return_storage_ptr__->d,(QArrayDataPointer<char16_t> *)&pQVar1[4].children.d.size)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

QString QIODevice::errorString() const
{
    Q_D(const QIODevice);
    if (d->errorString.isEmpty()) {
#ifdef QT_NO_QOBJECT
        return QLatin1StringView(QT_TRANSLATE_NOOP(QIODevice, "Unknown error"));
#else
        return tr("Unknown error");
#endif
    }
    return d->errorString;
}